

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

bool __thiscall
metaf::VisibilityGroup::appendDirection(VisibilityGroup *this,string *group,IncompleteText next)

{
  optional<metaf::Direction> oVar1;
  optional<std::pair<metaf::Direction,_metaf::Direction>_> d;
  _Storage<std::pair<metaf::Direction,_metaf::Direction>,_true> local_38;
  char local_28;
  
  oVar1 = Direction::fromCardinalString(group,false,false);
  if (((undefined1  [12])
       oVar1.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
       super__Optional_payload_base<metaf::Direction> & (undefined1  [12])0x1) ==
      (undefined1  [12])0x0) {
    Direction::fromSectorString
              ((optional<std::pair<metaf::Direction,_metaf::Direction>_> *)&local_38._M_value,group)
    ;
    if (local_28 == '\x01') {
      if ((this->dirSecFrom).super__Optional_base<metaf::Direction,_true,_true>._M_payload.
          super__Optional_payload_base<metaf::Direction>._M_engaged == false) {
        (this->dirSecFrom).super__Optional_base<metaf::Direction,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::Direction>._M_engaged = true;
      }
      (this->dirSecFrom).super__Optional_base<metaf::Direction,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::Direction>._M_payload =
           (_Storage<metaf::Direction,_true>)local_38._M_value.first;
      if ((this->dirSecTo).super__Optional_base<metaf::Direction,_true,_true>._M_payload.
          super__Optional_payload_base<metaf::Direction>._M_engaged == false) {
        (this->dirSecTo).super__Optional_base<metaf::Direction,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::Direction>._M_engaged = true;
      }
      (this->dirSecTo).super__Optional_base<metaf::Direction,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::Direction>._M_payload =
           (_Storage<metaf::Direction,_true>)local_38._M_value.second;
      if (this->visType == PREVAILING) {
        this->visType = SECTOR;
      }
      this->incompleteText = next;
    }
  }
  else {
    (this->dir).super__Optional_base<metaf::Direction,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::Direction>._M_payload =
         oVar1.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::Direction>._M_payload;
    (this->dir).super__Optional_base<metaf::Direction,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::Direction>._M_engaged =
         oVar1.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::Direction>._M_engaged;
    if (this->visType == PREVAILING) {
      this->visType = DIRECTIONAL;
    }
    this->incompleteText = next;
    local_28 = '\x01';
  }
  return (bool)local_28;
}

Assistant:

bool VisibilityGroup::appendDirection(const std::string & group, IncompleteText next) {
	if (const auto d = Direction::fromCardinalString(group); d.has_value()) {
		dir = d;
		if (visType == Type::PREVAILING) visType = Type::DIRECTIONAL;
		incompleteText = next;
		return true;
	}
	if (const auto d = Direction::fromSectorString(group); d.has_value()) {
		dirSecFrom = std::get<0>(*d);
		dirSecTo = std::get<1>(*d);
		if (visType == Type::PREVAILING) visType = Type::SECTOR;
		incompleteText = next;
		return true;
	}
	return false;
}